

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall cmCTestTestHandler::ProcessOptions(cmCTestTestHandler *this)

{
  bool bVar1;
  bool bVar2;
  cmValue cVar3;
  ostream *poVar4;
  undefined8 uVar5;
  _Storage<unsigned_long,_true> op;
  cmCTest *pcVar6;
  Repeat RVar7;
  optional<unsigned_long> level;
  unsigned_long plevel;
  unsigned_long n;
  RegularExpression repeatRegex;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&repeatRegex,"TestsToRunInformation",(allocator<char> *)&cmCTestLog_msg);
  cVar3 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
  SetTestsToRunInformation(this,cVar3);
  std::__cxx11::string::~string((string *)&repeatRegex);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&repeatRegex,"UseUnion",(allocator<char> *)&plevel);
  _cmCTestLog_msg =
       cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
  bVar1 = cmValue::IsOn((cmValue *)&cmCTestLog_msg);
  this->UseUnion = bVar1;
  std::__cxx11::string::~string((string *)&repeatRegex);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&repeatRegex,"ScheduleRandom",(allocator<char> *)&plevel);
  _cmCTestLog_msg =
       cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
  bVar1 = cmValue::IsOn((cmValue *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&repeatRegex);
  if (bVar1) {
    pcVar6 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"Random",(allocator<char> *)&cmCTestLog_msg);
    cmCTest::SetScheduleType(pcVar6,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&repeatRegex,"Repeat",(allocator<char> *)&cmCTestLog_msg);
  cVar3 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
  std::__cxx11::string::~string((string *)&repeatRegex);
  if (cVar3.Value == (string *)0x0) {
LAB_0018c5ee:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"ParallelLevel",(allocator<char> *)&cmCTestLog_msg);
    op._M_value = (unsigned_long)&repeatRegex;
    cVar3 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)op);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      if ((cVar3.Value)->_M_string_length == 0) {
        pcVar6 = (this->super_cmCTestGenericHandler).CTest;
        uVar5 = 0;
      }
      else {
        plevel = 0;
        bVar1 = cmStrToULong(cVar3.Value,&plevel);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&repeatRegex);
          poVar4 = std::operator<<((ostream *)&repeatRegex,"ParallelLevel invalid value: ");
          poVar4 = std::operator<<(poVar4,(string *)cVar3.Value);
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar6 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar6,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x233,(char *)_cmCTestLog_msg,false);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&repeatRegex);
          goto LAB_0018ca6b;
        }
        pcVar6 = (this->super_cmCTestGenericHandler).CTest;
        uVar5 = 1;
        op._M_value = plevel;
      }
      level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
      level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = op._M_value;
      cmCTest::SetParallelLevel(pcVar6,level);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"StopOnFailure",(allocator<char> *)&cmCTestLog_msg);
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      cmCTest::SetStopOnFailure((this->super_cmCTestGenericHandler).CTest,true);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"LabelRegularExpression",(allocator<char> *)&plevel);
    cmCTestGenericHandler::GetMultiOption
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmCTestLog_msg,&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cmCTestLog_msg,&this->IncludeLabelRegularExpressions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&repeatRegex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"ExcludeLabelRegularExpression",(allocator<char> *)&plevel);
    cmCTestGenericHandler::GetMultiOption
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmCTestLog_msg,&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cmCTestLog_msg,&this->ExcludeLabelRegularExpressions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&repeatRegex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"IncludeRegularExpression",(allocator<char> *)&cmCTestLog_msg)
    ;
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      this->UseIncludeRegExpFlag = true;
      std::__cxx11::string::_M_assign((string *)&this->IncludeRegExp);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"ExcludeRegularExpression",(allocator<char> *)&cmCTestLog_msg)
    ;
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      this->UseExcludeRegExpFlag = true;
      this->UseExcludeRegExpFirst = (bool)(this->UseIncludeRegExpFlag ^ 1);
      std::__cxx11::string::_M_assign((string *)&this->ExcludeRegExp);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"ExcludeFixtureRegularExpression",
               (allocator<char> *)&cmCTestLog_msg);
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureRegExp);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"ExcludeFixtureSetupRegularExpression",
               (allocator<char> *)&cmCTestLog_msg);
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureSetupRegExp);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"ExcludeFixtureCleanupRegularExpression",
               (allocator<char> *)&cmCTestLog_msg);
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureCleanupRegExp);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"ResourceSpecFile",(allocator<char> *)&cmCTestLog_msg);
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"TestListFile",(allocator<char> *)&cmCTestLog_msg);
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->TestListFile);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"ExcludeTestListFile",(allocator<char> *)&cmCTestLog_msg);
    cVar3 = cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&repeatRegex);
    std::__cxx11::string::~string((string *)&repeatRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeTestListFile);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repeatRegex,"RerunFailed",(allocator<char> *)&plevel);
    _cmCTestLog_msg =
         cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&repeatRegex)
    ;
    bVar1 = cmValue::IsOn((cmValue *)&cmCTestLog_msg);
    this->RerunFailed = bVar1;
    std::__cxx11::string::~string((string *)&repeatRegex);
    bVar1 = true;
  }
  else {
    cmsys::RegularExpression::RegularExpression
              (&repeatRegex,"^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    bVar1 = cmsys::RegularExpression::find(&repeatRegex,cVar3.Value);
    if (bVar1) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                ((string *)&cmCTestLog_msg,&repeatRegex.regmatch,2);
      n = 1;
      cmStrToULong((string *)&cmCTestLog_msg,&n);
      this->RepeatCount = (int)n;
      if (1 < (int)n) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&plevel,&repeatRegex.regmatch,1);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&plevel,"UNTIL_FAIL");
        RVar7 = UntilFail;
        if (bVar2) {
LAB_0018c538:
          this->RepeatMode = RVar7;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&plevel,"UNTIL_PASS");
          RVar7 = UntilPass;
          if (bVar2) goto LAB_0018c538;
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&plevel,"AFTER_TIMEOUT");
          if (bVar2) {
            RVar7 = AfterTimeout;
            goto LAB_0018c538;
          }
        }
        std::__cxx11::string::~string((string *)&plevel);
      }
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Repeat option invalid value: ");
      poVar4 = std::operator<<(poVar4,(string *)cVar3.Value);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar6,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x225,(char *)plevel,false);
      std::__cxx11::string::~string((string *)&plevel);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    cmsys::RegularExpression::~RegularExpression(&repeatRegex);
    if (bVar1) goto LAB_0018c5ee;
LAB_0018ca6b:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmCTestTestHandler::ProcessOptions()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(this->GetOption("UseUnion").IsOn());
  if (this->GetOption("ScheduleRandom").IsOn()) {
    this->CTest->SetScheduleType("Random");
  }
  if (cmValue repeat = this->GetOption("Repeat")) {
    cmsys::RegularExpression repeatRegex(
      "^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    if (repeatRegex.find(*repeat)) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->RepeatCount = static_cast<int>(n);
      if (this->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "UNTIL_FAIL") {
          this->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "UNTIL_PASS") {
          this->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "AFTER_TIMEOUT") {
          this->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Repeat option invalid value: " << *repeat << std::endl);
      return false;
    }
  }
  if (cmValue parallelLevel = this->GetOption("ParallelLevel")) {
    if (parallelLevel.IsEmpty()) {
      // An empty value tells ctest to choose a default.
      this->CTest->SetParallelLevel(cm::nullopt);
    } else {
      // A non-empty value must be a non-negative integer.
      unsigned long plevel = 0;
      if (!cmStrToULong(*parallelLevel, &plevel)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "ParallelLevel invalid value: " << *parallelLevel
                                                   << std::endl);
        return false;
      }
      this->CTest->SetParallelLevel(plevel);
    }
  }

  if (this->GetOption("StopOnFailure")) {
    this->CTest->SetStopOnFailure(true);
  }

  BuildLabelRE(this->GetMultiOption("LabelRegularExpression"),
               this->IncludeLabelRegularExpressions);
  BuildLabelRE(this->GetMultiOption("ExcludeLabelRegularExpression"),
               this->ExcludeLabelRegularExpressions);
  cmValue val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(*val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(*val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = *val;
  }
  val = this->GetOption("ResourceSpecFile");
  if (val) {
    this->ResourceSpecFile = *val;
  }
  val = this->GetOption("TestListFile");
  if (val) {
    this->TestListFile = val;
  }
  val = this->GetOption("ExcludeTestListFile");
  if (val) {
    this->ExcludeTestListFile = val;
  }
  this->SetRerunFailed(this->GetOption("RerunFailed").IsOn());

  return true;
}